

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O2

void multikey_cache<8u,false>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  uint64_t uVar3;
  Cacheblock<8U>_conflict *pCVar4;
  Cacheblock<8U>_conflict *pCVar5;
  Cacheblock<8U>_conflict *pCVar6;
  ulong uVar7;
  size_t N_00;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  Cacheblock<8U>_conflict __tmp;
  
  if (0x1f < N) {
    uVar15 = N >> 3;
    pCVar4 = med3char<Cacheblock<8u>,Cmp>(cache,cache + uVar15,cache + (N >> 2));
    pCVar5 = med3char<Cacheblock<8u>,Cmp>
                       (cache + ((N >> 1) - uVar15),cache + (N >> 1),cache + (N >> 1) + uVar15);
    uVar9 = N - 1;
    pCVar6 = med3char<Cacheblock<8u>,Cmp>
                       (cache + (uVar9 - (N >> 2)),cache + (uVar9 - uVar15),cache + (N - 3));
    pCVar4 = med3char<Cacheblock<8u>,Cmp>(pCVar4,pCVar5,pCVar6);
    uVar3 = cache->cached_bytes;
    puVar1 = cache->ptr;
    puVar2 = pCVar4->ptr;
    cache->cached_bytes = pCVar4->cached_bytes;
    cache->ptr = puVar2;
    pCVar4->cached_bytes = uVar3;
    pCVar4->ptr = puVar1;
    uVar15 = cache->cached_bytes;
    uVar8 = 1;
    uVar7 = uVar9;
    uVar11 = uVar8;
    uVar13 = uVar9;
    do {
      for (pCVar4 = cache + uVar8;
          (uVar8 <= uVar7 && (uVar14 = pCVar4->cached_bytes, uVar15 > uVar14 || uVar14 == uVar15));
          pCVar4 = pCVar4 + 1) {
        uVar12 = uVar11;
        if (uVar15 <= uVar14) {
          uVar12 = uVar11 + 1;
          uVar3 = cache[uVar11].cached_bytes;
          puVar1 = cache[uVar11].ptr;
          puVar2 = pCVar4->ptr;
          cache[uVar11].cached_bytes = pCVar4->cached_bytes;
          cache[uVar11].ptr = puVar2;
          pCVar4->cached_bytes = uVar3;
          pCVar4->ptr = puVar1;
        }
        uVar8 = uVar8 + 1;
        uVar11 = uVar12;
      }
      pCVar5 = cache + uVar7;
      while( true ) {
        if (uVar7 < uVar8) {
          uVar9 = uVar9 - uVar13;
          N_00 = uVar13 - uVar7;
          uVar8 = uVar8 - uVar11;
          uVar7 = uVar11;
          if (uVar8 < uVar11) {
            uVar7 = uVar8;
          }
          std::swap_ranges<Cacheblock<8u>*,Cacheblock<8u>*>(cache,cache + uVar7,pCVar4 + -uVar7);
          uVar7 = uVar9;
          if (N_00 < uVar9) {
            uVar7 = N_00;
          }
          std::swap_ranges<Cacheblock<8u>*,Cacheblock<8u>*>
                    (pCVar4,pCVar4 + uVar7,cache + (N - uVar7));
          multikey_cache<8u,false>(cache,uVar8,depth);
          multikey_cache<8u,false>(pCVar4 + ((N - 1) - uVar13),N_00,depth);
          if ((char)uVar15 == '\0') {
            return;
          }
          multikey_cache<8u,true>(pCVar4 + -uVar11,uVar9 + uVar11,depth + 8);
          return;
        }
        if (pCVar5->cached_bytes < uVar15) break;
        uVar14 = uVar13;
        if (pCVar5->cached_bytes == uVar15) {
          uVar14 = uVar13 - 1;
          uVar3 = cache[uVar13].cached_bytes;
          puVar1 = cache[uVar13].ptr;
          puVar2 = pCVar5->ptr;
          cache[uVar13].cached_bytes = pCVar5->cached_bytes;
          cache[uVar13].ptr = puVar2;
          pCVar5->cached_bytes = uVar3;
          pCVar5->ptr = puVar1;
        }
        uVar7 = uVar7 - 1;
        pCVar5 = pCVar5 + -1;
        uVar13 = uVar14;
      }
      uVar3 = pCVar4->cached_bytes;
      puVar1 = pCVar4->ptr;
      puVar2 = pCVar5->ptr;
      pCVar4->cached_bytes = pCVar5->cached_bytes;
      pCVar4->ptr = puVar2;
      pCVar5->cached_bytes = uVar3;
      pCVar5->ptr = puVar1;
      uVar8 = uVar8 + 1;
      uVar7 = uVar7 - 1;
    } while( true );
  }
  if (N == 0) {
    return;
  }
  uVar9 = N & 0xffffffff;
  pCVar4 = cache;
  while (1 < (int)uVar9) {
    uVar9 = (ulong)((int)uVar9 - 1);
    uVar15 = pCVar4[1].cached_bytes;
    puVar1 = pCVar4[1].ptr;
    pCVar5 = pCVar4 + 1;
    while ((cache < pCVar5 && (uVar15 < pCVar5[-1].cached_bytes))) {
      puVar2 = pCVar5[-1].ptr;
      pCVar5->cached_bytes = pCVar5[-1].cached_bytes;
      pCVar5->ptr = puVar2;
      pCVar5 = pCVar5 + -1;
    }
    pCVar5->cached_bytes = uVar15;
    pCVar5->ptr = puVar1;
    pCVar4 = pCVar4 + 1;
  }
  lVar17 = 0;
  do {
    lVar16 = lVar17;
    pCVar4 = cache + lVar16 + 1;
    lVar10 = -1;
    while( true ) {
      if (lVar16 - N == lVar10) {
        if (lVar10 == 0 || lVar10 == -1) {
          return;
        }
        if ((char)cache[lVar16].cached_bytes == '\0') {
          return;
        }
        insertion_sort<8u>(cache + lVar16,-(int)lVar10,depth + 8);
        return;
      }
      if (pCVar4[-1].cached_bytes != pCVar4->cached_bytes) break;
      lVar10 = lVar10 + -1;
      pCVar4 = pCVar4 + 1;
    }
    lVar17 = lVar16 - lVar10;
    if ((lVar10 != 0 && lVar10 != -1) && ((char)cache[lVar16].cached_bytes != '\0')) {
      insertion_sort<8u>(cache + lVar16,-(int)lVar10,depth + 8);
    }
  } while( true );
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}